

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

Type * __thiscall
Fixpp::
get<Fixpp::TagT<553u,Fixpp::Type::String>,Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>
          (Type *__return_storage_ptr__,Fixpp *this,
          VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
          *message)

{
  bool bVar1;
  runtime_error *this_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<554U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<925U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
  *this_01;
  VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
  *message_local;
  
  bVar1 = std::bitset<7UL>::test((bitset<7UL> *)(this + 0x78),2);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Bad tag access: tag is not present in message");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = meta::
            get<2ul,Fixpp::FieldRef<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<554u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<925u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<96u,Fixpp::Type::Data>>>
                      ((tuple<Fixpp::FieldRef<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<554U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<925U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<95U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<96U,_Fixpp::Type::Data>_>_>
                        *)this);
  FieldRef<Fixpp::TagT<553u,Fixpp::Type::String>>::get_abi_cxx11_(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }